

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::MaybeJsonFile(Value *__return_storage_ptr__,cmFileAPI *this,Value *in,string *prefix)

{
  bool bVar1;
  Value *this_00;
  Value local_d8;
  string local_b0;
  Value local_90;
  Value local_68;
  undefined1 local_29;
  string *local_28;
  string *prefix_local;
  Value *in_local;
  cmFileAPI *this_local;
  Value *out;
  
  local_29 = 0;
  local_28 = prefix;
  prefix_local = (string *)in;
  in_local = (Value *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  bVar1 = Json::Value::isObject(in);
  if ((bVar1) || (bVar1 = Json::Value::isArray(in), bVar1)) {
    Json::Value::Value(&local_68,objectValue);
    Json::Value::operator=(__return_storage_ptr__,&local_68);
    Json::Value::~Value(&local_68);
    WriteJsonFile(&local_b0,this,in,local_28,ComputeSuffixHash);
    Json::Value::Value(&local_90,&local_b0);
    this_00 = Json::Value::operator[](__return_storage_ptr__,"jsonFile");
    Json::Value::operator=(this_00,&local_90);
    Json::Value::~Value(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    Json::Value::Value(&local_d8,in);
    Json::Value::operator=(__return_storage_ptr__,&local_d8);
    Json::Value::~Value(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::MaybeJsonFile(Json::Value in, std::string const& prefix)
{
  Json::Value out;
  if (in.isObject() || in.isArray()) {
    out = Json::objectValue;
    out["jsonFile"] = this->WriteJsonFile(in, prefix);
  } else {
    out = std::move(in);
  }
  return out;
}